

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualStack.cpp
# Opt level: O1

void __thiscall VirtualStack::VirtualStack(VirtualStack *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  this->_vptr_VirtualStack = (_func_int **)&PTR__VirtualStack_00115d88;
  paVar1 = &this->stack[0].identifier.field_2;
  lVar2 = 0x15f900;
  do {
    *(undefined4 *)((long)paVar1 + -0x18) = 0xfffffffe;
    (((string *)(paVar1 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
    *(size_type *)((long)paVar1 + -8) = 0;
    paVar1->_M_local_buf[0] = '\0';
    paVar1[1]._M_local_buf[0] = 0;
    *(undefined4 *)((long)paVar1 + 0x14) = 0;
    paVar1 = paVar1 + 3;
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != 0);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  (this->errorDefault).type = INT;
  (this->errorDefault).identifier._M_dataplus._M_p =
       (pointer)&(this->errorDefault).identifier.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->errorDefault).identifier,local_48,local_48 + local_40);
  (this->errorDefault).isArray = false;
  (this->errorDefault).arrayLength = 0;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  Parser::Parser(&this->parser);
  this->stackOffset = 0;
  return;
}

Assistant:

VirtualStack::VirtualStack()
: errorDefault("", DataType::INT)
{
    //ctor
    stackOffset = 0;
}